

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::fea::ChElementShellReissner4::EvaluateGP
          (ChVector<double> *__return_storage_ptr__,ChElementShellReissner4 *this,int igp)

{
  ChVariables *pCVar1;
  _func_int *p_Var2;
  double dVar3;
  _func_int *p_Var4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  ChVariables *pCVar10;
  ChVariables *pCVar11;
  _func_int *p_Var12;
  _func_int *p_Var13;
  double dVar14;
  double dVar15;
  _func_int *p_Var16;
  ChVector<double> *v;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 local_70 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_50 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  GetNodeA((ChElementShellReissner4 *)(local_50 + 0x10));
  lVar17 = (long)igp;
  auVar18._0_8_ = (double)(&xi_i)[lVar17 * 2] + 1.0;
  auVar18._8_8_ = (double)(&DAT_011df688)[lVar17 * 2] + 1.0;
  auVar9 = vshufpd_avx(auVar18,auVar18,1);
  dVar5 = auVar18._0_8_ * 0.25 * auVar9._0_8_;
  pCVar1 = *(pointer)(local_50._16_8_ + 0x30);
  pCVar10 = *(pointer)(local_50._16_8_ + 0x20);
  pCVar11 = *(pointer)(local_50._16_8_ + 0x28);
  GetNodeB((ChElementShellReissner4 *)local_50);
  dVar6 = (1.0 - (double)(&xi_i)[lVar17 * 2]) * 0.25 * ((double)(&DAT_011df688)[lVar17 * 2] + 1.0);
  p_Var12 = *(_func_int **)(local_50._0_8_ + 0x20);
  p_Var13 = *(_func_int **)(local_50._0_8_ + 0x28);
  p_Var2 = *(_func_int **)(local_50._0_8_ + 0x30);
  GetNodeC((ChElementShellReissner4 *)(local_70 + 0x10));
  auVar9._8_8_ = 0x3ff0000000000000;
  auVar9._0_8_ = 0x3ff0000000000000;
  auVar18 = vsubpd_avx(auVar9,*(undefined1 (*) [16])(&xi_i + lVar17 * 2));
  auVar9 = vshufpd_avx(auVar18,auVar18,1);
  dVar7 = auVar18._0_8_ * 0.25 * auVar9._0_8_;
  dVar14 = *(double *)(local_70._16_8_ + 0x20);
  dVar15 = *(double *)(local_70._16_8_ + 0x28);
  dVar3 = *(double *)(local_70._16_8_ + 0x30);
  GetNodeD((ChElementShellReissner4 *)local_70);
  dVar8 = ((double)(&xi_i)[lVar17 * 2] + 1.0) * 0.25 * (1.0 - (double)(&DAT_011df688)[lVar17 * 2]);
  p_Var16 = *(_func_int **)(local_70._0_8_ + 0x28);
  p_Var4 = *(_func_int **)(local_70._0_8_ + 0x30);
  __return_storage_ptr__->m_data[0] =
       dVar8 * (double)*(_func_int **)(local_70._0_8_ + 0x20) +
       dVar7 * dVar14 + dVar6 * (double)p_Var12 + dVar5 * (double)pCVar10;
  __return_storage_ptr__->m_data[1] =
       dVar8 * (double)p_Var16 + dVar7 * dVar15 + dVar6 * (double)p_Var13 + dVar5 * (double)pCVar11;
  __return_storage_ptr__->m_data[2] =
       dVar8 * (double)p_Var4 + dVar7 * dVar3 + dVar6 * (double)p_Var2 + dVar5 * (double)pCVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementShellReissner4::EvaluateGP(int igp) {
    return GetNodeA()->GetPos() * L1(xi_i[igp]) + GetNodeB()->GetPos() * L2(xi_i[igp]) +
           GetNodeC()->GetPos() * L3(xi_i[igp]) + GetNodeD()->GetPos() * L4(xi_i[igp]);
}